

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O0

int Abc_NtkDarInduction(Abc_Ntk_t *pNtk,int nTimeOut,int nFramesMax,int nConfMax,int fUnique,
                       int fUniqueAll,int fGetCex,int fVerbose,int fVeryVerbose)

{
  abctime aVar1;
  Aig_Man_t *p;
  abctime aVar2;
  int RetValue;
  abctime clkTotal;
  Aig_Man_t *pMan;
  int fUniqueAll_local;
  int fUnique_local;
  int nConfMax_local;
  int nFramesMax_local;
  int nTimeOut_local;
  Abc_Ntk_t *pNtk_local;
  
  aVar1 = Abc_Clock();
  p = Abc_NtkToDar(pNtk,0,1);
  if (p == (Aig_Man_t *)0x0) {
    pNtk_local._4_4_ = -1;
  }
  else {
    pNtk_local._4_4_ =
         Saig_ManInduction(p,nTimeOut,nFramesMax,nConfMax,fUnique,fUniqueAll,fGetCex,fVerbose,
                           fVeryVerbose);
    if (pNtk_local._4_4_ == 1) {
      Abc_Print(1,"Networks are equivalent.   ");
      Abc_Print(1,"%s =","Time");
      aVar2 = Abc_Clock();
      Abc_Print(1,"%9.2f sec\n",((double)(aVar2 - aVar1) * 1.0) / 1000000.0);
    }
    else if (pNtk_local._4_4_ == 0) {
      Abc_Print(1,"Networks are NOT EQUIVALENT.   ");
      Abc_Print(1,"%s =","Time");
      aVar2 = Abc_Clock();
      Abc_Print(1,"%9.2f sec\n",((double)(aVar2 - aVar1) * 1.0) / 1000000.0);
    }
    else {
      Abc_Print(1,"Networks are UNDECIDED.   ");
      Abc_Print(1,"%s =","Time");
      aVar2 = Abc_Clock();
      Abc_Print(1,"%9.2f sec\n",((double)(aVar2 - aVar1) * 1.0) / 1000000.0);
    }
    if (fGetCex != 0) {
      if (pNtk->pModel != (int *)0x0) {
        free(pNtk->pModel);
        pNtk->pModel = (int *)0x0;
      }
      if (pNtk->pSeqModel != (Abc_Cex_t *)0x0) {
        free(pNtk->pSeqModel);
        pNtk->pSeqModel = (Abc_Cex_t *)0x0;
      }
      pNtk->pSeqModel = p->pSeqModel;
      p->pSeqModel = (Abc_Cex_t *)0x0;
    }
    Aig_ManStop(p);
  }
  return pNtk_local._4_4_;
}

Assistant:

int Abc_NtkDarInduction( Abc_Ntk_t * pNtk, int nTimeOut, int nFramesMax, int nConfMax, int fUnique, int fUniqueAll, int fGetCex, int fVerbose, int fVeryVerbose )
{ 
    Aig_Man_t * pMan;
    abctime clkTotal = Abc_Clock();
    int RetValue;
    pMan = Abc_NtkToDar( pNtk, 0, 1 );
    if ( pMan == NULL )
        return -1;
    RetValue = Saig_ManInduction( pMan, nTimeOut, nFramesMax, nConfMax, fUnique, fUniqueAll, fGetCex, fVerbose, fVeryVerbose );
    if ( RetValue == 1 )
    {
        Abc_Print( 1, "Networks are equivalent.   " );
ABC_PRT( "Time", Abc_Clock() - clkTotal );
    }
    else if ( RetValue == 0 )
    {
        Abc_Print( 1, "Networks are NOT EQUIVALENT.   " );
ABC_PRT( "Time", Abc_Clock() - clkTotal );
    }
    else
    {
        Abc_Print( 1, "Networks are UNDECIDED.   " );
ABC_PRT( "Time", Abc_Clock() - clkTotal );
    }
    if ( fGetCex )
    {
        ABC_FREE( pNtk->pModel );
        ABC_FREE( pNtk->pSeqModel );
        pNtk->pSeqModel = pMan->pSeqModel; pMan->pSeqModel = NULL;
    }
    Aig_ManStop( pMan );
    return RetValue;
}